

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_drop(textblock *tb,monster_race *race,monster_lore_conflict *lore,
                     bitflag *known_flags)

{
  monster_race *tb_00;
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  monster_sex_t sex;
  char *pcVar4;
  char *pcVar5;
  _Bool only_gold;
  uint uStack_30;
  _Bool only_item;
  monster_sex_t msex;
  wchar_t nspec;
  wchar_t n;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  msex = MON_SEX_NEUTER;
  uStack_30 = 0;
  _nspec = known_flags;
  known_flags_local = (bitflag *)lore;
  lore_local = (monster_lore_conflict *)race;
  race_local = (monster_race *)tb;
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    if ((lore->drop_known & 1U) != 0) {
      sex = lore_monster_sex(race);
      msex = mon_create_drop_count
                       ((monster_race *)lore_local,true,false,(int *)&stack0xffffffffffffffd0);
      tb_00 = race_local;
      if ((L'\0' < (int)msex) || (0 < (int)uStack_30)) {
        pcVar4 = lore_pronoun_nominative(sex,true);
        textblock_append((textblock *)tb_00,"%s may carry",pcVar4);
        if (0 < (int)msex) {
          _Var1 = flag_has_dbg(_nspec,0xb,0x1e,"known_flags","RF_ONLY_ITEM");
          _Var2 = flag_has_dbg(_nspec,0xb,0x1d,"known_flags","RF_ONLY_GOLD");
          if (msex == MON_SEX_MALE) {
            textblock_append_c((textblock *)race_local,'\x06'," a single ");
          }
          else if (msex == MON_SEX_FEMALE) {
            textblock_append_c((textblock *)race_local,'\x06'," one or two ");
          }
          else {
            textblock_append((textblock *)race_local," up to ");
            textblock_append_c((textblock *)race_local,'\x06',"%d ",(ulong)msex);
          }
          _Var3 = flag_has_dbg(_nspec,0xb,0x26,"known_flags","RF_DROP_GREAT");
          if (_Var3) {
            textblock_append_c((textblock *)race_local,'\x06',"exceptional ");
          }
          else {
            _Var3 = flag_has_dbg(_nspec,0xb,0x25,"known_flags","RF_DROP_GOOD");
            if (_Var3) {
              textblock_append_c((textblock *)race_local,'\x06',"good ");
            }
          }
          if ((_Var1) && (_Var2)) {
            pcVar4 = "s";
            if (msex == MON_SEX_MALE) {
              pcVar4 = "";
            }
            textblock_append_c((textblock *)race_local,'\x06',"error%s",pcVar4);
          }
          else if ((!_Var1) || (_Var2)) {
            if ((_Var1) || (!_Var2)) {
              if ((!_Var1) && (!_Var2)) {
                pcVar4 = "s";
                if (msex == MON_SEX_MALE) {
                  pcVar4 = "";
                }
                pcVar5 = "s";
                if (msex == MON_SEX_MALE) {
                  pcVar5 = "";
                }
                textblock_append_c((textblock *)race_local,'\x06',"object%s or treasure%s",pcVar4,
                                   pcVar5);
              }
            }
            else {
              pcVar4 = "s";
              if (msex == MON_SEX_MALE) {
                pcVar4 = "";
              }
              textblock_append_c((textblock *)race_local,'\x06',"treasure%s",pcVar4);
            }
          }
          else {
            pcVar4 = "s";
            if (msex == MON_SEX_MALE) {
              pcVar4 = "";
            }
            textblock_append_c((textblock *)race_local,'\x06',"object%s",pcVar4);
          }
        }
        if (0 < (int)uStack_30) {
          if (0 < (int)msex) {
            textblock_append((textblock *)race_local," and");
          }
          if (uStack_30 == 1) {
            textblock_append((textblock *)race_local," a single");
          }
          else if (uStack_30 == 2) {
            textblock_append((textblock *)race_local," one or two");
          }
          else {
            textblock_append((textblock *)race_local," up to");
            textblock_append_c((textblock *)race_local,'\x06'," %d",(ulong)uStack_30);
          }
          textblock_append((textblock *)race_local," specific items");
        }
        textblock_append((textblock *)race_local,".  ");
      }
    }
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-lore.c"
                ,0x4a0,
                "void lore_append_drop(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_drop(textblock *tb, const struct monster_race *race,
					  const struct monster_lore *lore,
					  bitflag known_flags[RF_SIZE])
{
	int n = 0, nspec = 0;
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);
	if (!lore->drop_known) return;

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Count maximum drop */
	n = mon_create_drop_count(race, true, false, &nspec);

	/* Drops gold and/or items */
	if (n > 0 || nspec > 0) {
		textblock_append(tb, "%s may carry",
			lore_pronoun_nominative(msex, true));

		/* Report general drops */
		if (n > 0) {
			bool only_item = rf_has(known_flags, RF_ONLY_ITEM);
			bool only_gold = rf_has(known_flags, RF_ONLY_GOLD);

			if (n == 1) {
				textblock_append_c(tb, COLOUR_BLUE,
					" a single ");
			} else if (n == 2) {
				textblock_append_c(tb, COLOUR_BLUE,
					" one or two ");
			} else {
				textblock_append(tb, " up to ");
				textblock_append_c(tb, COLOUR_BLUE, "%d ", n);
			}

			/* Quality */
			if (rf_has(known_flags, RF_DROP_GREAT)) {
				textblock_append_c(tb, COLOUR_BLUE,
					"exceptional ");
			} else if (rf_has(known_flags, RF_DROP_GOOD)) {
				textblock_append_c(tb, COLOUR_BLUE, "good ");
			}

			/* Objects or treasures */
			if (only_item && only_gold) {
				textblock_append_c(tb, COLOUR_BLUE,
					"error%s", PLURAL(n));
			} else if (only_item && !only_gold) {
				textblock_append_c(tb, COLOUR_BLUE,
					"object%s", PLURAL(n));
			} else if (!only_item && only_gold) {
				textblock_append_c(tb, COLOUR_BLUE,
					"treasure%s", PLURAL(n));
			} else if (!only_item && !only_gold) {
				textblock_append_c(tb, COLOUR_BLUE,
					"object%s or treasure%s",
					PLURAL(n), PLURAL(n));
			}
		}

		/*
		 * Report specific drops (just maximum number, no types,
		 * does not include quest artifacts).
		 */
		if (nspec > 0) {
			if (n > 0) {
				textblock_append(tb, " and");
			}
			if (nspec == 1) {
				textblock_append(tb, " a single");
			} else if (nspec == 2) {
				textblock_append(tb, " one or two");
			} else {
				textblock_append(tb, " up to");
				textblock_append_c(tb, COLOUR_BLUE, " %d",
					nspec);
			}
			textblock_append(tb, " specific items");
		}

		textblock_append(tb, ".  ");
	}
}